

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

void __thiscall interfaces::BlockInfo::BlockInfo(BlockInfo *this,uint256 *hash)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
  *(undefined4 *)(in_RDI + 3) = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BlockInfo(const uint256& hash LIFETIMEBOUND) : hash(hash) {}